

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O1

void remap_terminal_trees<PredictionData<double,unsigned_long>,unsigned_long>
               (IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,
               PredictionData<double,_unsigned_long> *prediction_data,unsigned_long *tree_num,
               int nthreads)

{
  pointer pvVar1;
  pointer pvVar2;
  size_t sVar3;
  pointer puVar4;
  pointer puVar5;
  ExtIsoForest *pEVar6;
  pointer pvVar7;
  long *plVar8;
  pointer pvVar9;
  long lVar10;
  ulong uVar11;
  unsigned_long uVar12;
  size_t sVar13;
  long lVar14;
  size_type sVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tree_mapping;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  size_t local_48;
  unsigned_long *local_40;
  PredictionData<double,_unsigned_long> *local_38;
  
  pEVar6 = (ExtIsoForest *)model_outputs;
  if (model_outputs == (IsoForest *)0x0) {
    pEVar6 = model_outputs_ext;
  }
  pvVar1 = (pEVar6->hplanes).
           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (pEVar6->hplanes).
           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar17 = ((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = tree_num;
  local_38 = prediction_data;
  if (model_outputs == (IsoForest *)0x0) {
    sVar15 = 0;
    for (pvVar9 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar9 != (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pvVar9 = pvVar9 + 1) {
      uVar11 = ((long)(pvVar9->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pvVar9->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x1084210842108421;
      if (sVar15 <= uVar11 && uVar11 - sVar15 != 0) {
        sVar15 = uVar11;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_68,sVar15);
    puVar5 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pvVar2 != pvVar1) {
      pvVar1 = (model_outputs_ext->hplanes).
               super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_48 = ((long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                  (-8 - (long)local_68.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8;
      lVar18 = 0;
      lVar14 = 0;
      do {
        if (puVar4 != puVar5) {
          memset(puVar4,0,local_48);
        }
        lVar16 = *(long *)&pvVar1[lVar14].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>.
                           _M_impl;
        lVar10 = (long)*(pointer *)
                        ((long)&pvVar1[lVar14].
                                super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>._M_impl +
                        8) - lVar16;
        if (lVar10 != 0) {
          lVar10 = (lVar10 >> 3) * -0x1084210842108421;
          plVar8 = (long *)(lVar16 + 200);
          lVar16 = 0;
          uVar12 = 0;
          do {
            if (*plVar8 == 0) {
              puVar4[lVar16] = uVar12;
              uVar12 = uVar12 + 1;
            }
            lVar16 = lVar16 + 1;
            plVar8 = plVar8 + 0x1f;
          } while (lVar10 + (ulong)(lVar10 == 0) != lVar16);
        }
        sVar3 = local_38->nrows;
        if (sVar3 != 0) {
          sVar13 = 0;
          do {
            *(unsigned_long *)((long)local_40 + sVar13 * 8 + sVar3 * lVar18) =
                 puVar4[*(long *)((long)local_40 + sVar13 * 8 + sVar3 * lVar18)];
            sVar13 = sVar13 + 1;
          } while (sVar3 != sVar13);
        }
        lVar14 = lVar14 + 1;
        lVar18 = lVar18 + 8;
      } while (lVar14 != lVar17 + (ulong)(lVar17 == 0));
    }
  }
  else {
    sVar15 = 0;
    for (pvVar7 = (model_outputs->trees).
                  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar7 != (model_outputs->trees).
                  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pvVar7 = pvVar7 + 1) {
      uVar11 = ((long)(pvVar7->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pvVar7->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      if (sVar15 <= uVar11 && uVar11 - sVar15 != 0) {
        sVar15 = uVar11;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_68,sVar15);
    puVar5 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pvVar2 != pvVar1) {
      pvVar7 = (model_outputs->trees).
               super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_48 = ((long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                  (-8 - (long)local_68.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8;
      lVar18 = 0;
      lVar14 = 0;
      do {
        if (puVar4 != puVar5) {
          memset(puVar4,0,local_48);
        }
        lVar16 = *(long *)&pvVar7[lVar14].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>.
                           _M_impl;
        lVar10 = (long)*(pointer *)
                        ((long)&pvVar7[lVar14].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>
                                ._M_impl + 8) - lVar16;
        if (lVar10 != 0) {
          lVar10 = (lVar10 >> 4) * 0x6db6db6db6db6db7;
          plVar8 = (long *)(lVar16 + 0x38);
          uVar12 = 0;
          lVar16 = 0;
          do {
            if (*plVar8 == 0) {
              puVar4[lVar16] = uVar12;
              uVar12 = uVar12 + 1;
            }
            lVar16 = lVar16 + 1;
            plVar8 = plVar8 + 0xe;
          } while (lVar10 + (ulong)(lVar10 == 0) != lVar16);
        }
        sVar3 = local_38->nrows;
        if (sVar3 != 0) {
          sVar13 = 0;
          do {
            *(unsigned_long *)((long)local_40 + sVar13 * 8 + sVar3 * lVar18) =
                 puVar4[*(long *)((long)local_40 + sVar13 * 8 + sVar3 * lVar18)];
            sVar13 = sVar13 + 1;
          } while (sVar3 != sVar13);
        }
        lVar14 = lVar14 + 1;
        lVar18 = lVar18 + 8;
      } while (lVar14 != lVar17 + (ulong)(lVar17 == 0));
    }
  }
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void remap_terminal_trees(IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                          PredictionData &prediction_data, sparse_ix *restrict tree_num, int nthreads)
{
    size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
    size_t max_tree, curr_term;
    std::vector<sparse_ix> tree_mapping;
    if (model_outputs != NULL)
    {
        max_tree = std::accumulate(model_outputs->trees.begin(),
                                   model_outputs->trees.end(),
                                   (size_t)0,
                                   [](const size_t curr_max, const std::vector<IsoTree> &tr)
                                   {return std::max(curr_max, tr.size());});
        tree_mapping.resize(max_tree);
        for (size_t tree = 0; tree < ntrees; tree++)
        {
            std::fill(tree_mapping.begin(), tree_mapping.end(), (size_t)0);
            curr_term = 0;
            for (size_t node = 0; node < model_outputs->trees[tree].size(); node++)
                if (model_outputs->trees[tree][node].tree_left == 0)
                    tree_mapping[node] = curr_term++;

            #pragma omp parallel for schedule(static) num_threads(nthreads) shared(tree_num, tree_mapping, tree, prediction_data)
            for (size_t_for row = 0; row < (decltype(row))prediction_data.nrows; row++)
                tree_num[row + tree * prediction_data.nrows] = tree_mapping[tree_num[row + tree * prediction_data.nrows]];
        }
    }

    else
    {
        max_tree = std::accumulate(model_outputs_ext->hplanes.begin(),
                                   model_outputs_ext->hplanes.end(),
                                   (size_t)0,
                                   [](const size_t curr_max, const std::vector<IsoHPlane> &tr)
                                   {return std::max(curr_max, tr.size());});
        tree_mapping.resize(max_tree);
        for (size_t tree = 0; tree < ntrees; tree++)
        {
            std::fill(tree_mapping.begin(), tree_mapping.end(), (size_t)0);
            curr_term = 0;
            for (size_t node = 0; node < model_outputs_ext->hplanes[tree].size(); node++)
                if (model_outputs_ext->hplanes[tree][node].hplane_left == 0)
                    tree_mapping[node] = curr_term++;
            
            #pragma omp parallel for schedule(static) num_threads(nthreads) shared(tree_num, tree_mapping, tree, prediction_data)
            for (size_t_for row = 0; row < (decltype(row))prediction_data.nrows; row++)
                tree_num[row + tree * prediction_data.nrows] = tree_mapping[tree_num[row + tree * prediction_data.nrows]];
        }
    }
}